

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void do_shifti(TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,uint vece,TCGv_vec r,TCGv_vec a,int64_t i
              )

{
  TCGType_conflict type_00;
  int iVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGArg a0;
  TCGArg a_00;
  TCGOpcode *n;
  TCGOpcode *hold_list;
  int can;
  TCGType_conflict type;
  TCGArg ai;
  TCGArg ri;
  TCGTemp *at;
  TCGTemp *rt;
  int64_t i_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGOpcode opc_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  a0 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  type_00 = (TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x10) & 0xff;
  tcg_assert_listed_vecop(opc);
  if (i == 0) {
    tcg_gen_mov_vec_tricore(tcg_ctx,r,a);
  }
  else {
    iVar1 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc,type_00,vece);
    if (iVar1 < 1) {
      n = tcg_swap_vecop_list((TCGOpcode *)0x0);
      tcg_expand_vec_op_tricore(tcg_ctx,opc,type_00,vece,a0,a_00,i);
      tcg_swap_vecop_list(n);
    }
    else {
      vec_gen_3_tricore(tcg_ctx,opc,type_00,vece,a0,a_00,i);
    }
  }
  return;
}

Assistant:

static void do_shifti(TCGContext *tcg_ctx, TCGOpcode opc, unsigned vece,
                      TCGv_vec r, TCGv_vec a, int64_t i)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type == type);
    tcg_debug_assert(i >= 0 && i < (8 << vece));
    tcg_assert_listed_vecop(opc);

    if (i == 0) {
        tcg_gen_mov_vec(tcg_ctx, r, a);
        return;
    }

    can = tcg_can_emit_vec_op(tcg_ctx, opc, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc, type, vece, ri, ai, i);
    } else {
        /* We leave the choice of expansion via scalar or vector shift
           to the target.  Often, but not always, dupi can feed a vector
           shift easier than a scalar.  */
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_debug_assert(can < 0);
        tcg_expand_vec_op(tcg_ctx, opc, type, vece, ri, ai, i);
        tcg_swap_vecop_list(hold_list);
    }
}